

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void generate_minimal_hash
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *str,Port_Matcher *pm)

{
  bool bVar1;
  ivec_t *in_stack_00000008;
  ivec_t *in_stack_00000010;
  words_t *in_stack_00000018;
  words_t *in_stack_00000078;
  ivec_t *in_stack_000000b0;
  words_t *in_stack_000000b8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffffb0);
  if (!bVar1) {
    find_pos(in_stack_00000078);
    std::vector<int,_std::allocator<int>_>::operator=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffb0);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffffb0);
    if (bVar1) {
      fprintf(_stderr,"rtosc: Failed to generate minimal hash\n");
    }
    else {
      find_assoc(in_stack_000000b8,in_stack_000000b0);
      std::vector<int,_std::allocator<int>_>::operator=
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffb0);
      find_remap(in_stack_00000018,in_stack_00000010,in_stack_00000008);
      std::vector<int,_std::allocator<int>_>::operator=
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffb0);
    }
  }
  return;
}

Assistant:

static void generate_minimal_hash(std::vector<std::string> str, Port_Matcher &pm)
{
    if(str.empty())
        return;
    pm.pos   = find_pos(str);
    if(pm.pos.empty()) {
        fprintf(stderr, "rtosc: Failed to generate minimal hash\n");
        return;
    }
    pm.assoc = find_assoc(str, pm.pos);
    pm.remap = find_remap(str, pm.pos, pm.assoc);
}